

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
fmt::v5::internal::
udl_formatter<wchar_t,(wchar_t)123,(wchar_t)125,(wchar_t)99,(wchar_t)123,(wchar_t)125>::operator()
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,void *this,wchar_t (*args) [3],int *args_1)

{
  int *in_R8;
  undefined1 local_39;
  wchar_t s [6];
  
  builtin_wcsncpy(s,L"{}c{}",6);
  do_check_format_string<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>
            ((v5 *)s,5,&local_39);
  format<wchar_t[6],wchar_t[3],int>
            (__return_storage_ptr__,(v5 *)s,(wchar_t (*) [6])args,(wchar_t (*) [3])args_1,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> operator()(const Args &... args) const {
    FMT_CONSTEXPR_DECL Char s[] = {CHARS..., '\0'};
    FMT_CONSTEXPR_DECL bool invalid_format =
        do_check_format_string<Char, error_handler, Args...>(
          basic_string_view<Char>(s, sizeof...(CHARS)));
    (void)invalid_format;
    return format(s, args...);
  }